

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O3

int lws_interface_to_sa(int ipv6,char *ifname,sockaddr_in *addr,size_t addrlen)

{
  short *psVar1;
  in_addr_t iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  short sVar5;
  int iVar6;
  long *in_RAX;
  int iVar7;
  long *plVar8;
  ifaddrs *ifr;
  long *local_38;
  
  local_38 = in_RAX;
  getifaddrs(&local_38);
  iVar7 = -1;
  plVar8 = local_38;
  if (local_38 == (long *)0x0) {
    local_38 = (long *)0x0;
  }
  else {
    do {
      if ((ushort *)plVar8[3] != (ushort *)0x0) {
        _lws_log(0x10," interface %s vs %s (fam %d) ipv6 %d\n",plVar8[1],ifname,
                 (ulong)*(ushort *)plVar8[3],(ulong)(uint)ipv6);
        iVar6 = strcmp((char *)plVar8[1],ifname);
        if (iVar6 == 0) {
          psVar1 = (short *)plVar8[3];
          if (*psVar1 == 0x11) {
            iVar7 = -2;
          }
          else if (*psVar1 == 2) {
            sVar5 = psVar1[1];
            iVar2 = *(in_addr_t *)(psVar1 + 2);
            uVar3 = *(undefined4 *)(psVar1 + 4);
            uVar4 = *(undefined4 *)(psVar1 + 6);
            addr->sin_family = psVar1[0];
            addr->sin_port = sVar5;
            (addr->sin_addr).s_addr = iVar2;
            *(undefined4 *)addr->sin_zero = uVar3;
            *(undefined4 *)(addr->sin_zero + 4) = uVar4;
            freeifaddrs(local_38);
            return 0;
          }
        }
      }
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)0x0);
  }
  freeifaddrs(local_38);
  iVar6 = inet_pton(2,ifname,&addr->sin_addr);
  if (iVar6 == 1) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int
lws_interface_to_sa(int ipv6, const char *ifname, struct sockaddr_in *addr,
		    size_t addrlen)
{
	int rc = LWS_ITOSA_NOT_EXIST;

	struct ifaddrs *ifr;
	struct ifaddrs *ifc;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *)addr;
#endif

	getifaddrs(&ifr);
	for (ifc = ifr; ifc != NULL && rc; ifc = ifc->ifa_next) {
		if (!ifc->ifa_addr)
			continue;

		lwsl_debug(" interface %s vs %s (fam %d) ipv6 %d\n",
			   ifc->ifa_name, ifname,
			   ifc->ifa_addr->sa_family, ipv6);

		if (strcmp(ifc->ifa_name, ifname))
			continue;

		switch (ifc->ifa_addr->sa_family) {
#if defined(AF_PACKET)
		case AF_PACKET:
			/* interface exists but is not usable */
			rc = LWS_ITOSA_NOT_USABLE;
			continue;
#endif

		case AF_INET:
#ifdef LWS_WITH_IPV6
			if (ipv6) {
				/* map IPv4 to IPv6 */
				memset((char *)&addr6->sin6_addr, 0,
						sizeof(struct in6_addr));
				addr6->sin6_addr.s6_addr[10] = 0xff;
				addr6->sin6_addr.s6_addr[11] = 0xff;
				memcpy(&addr6->sin6_addr.s6_addr[12],
				       &((struct sockaddr_in *)ifc->ifa_addr)->sin_addr,
							sizeof(struct in_addr));
				lwsl_debug("%s: uplevelling ipv4 bind to ipv6\n", __func__);
			} else
#endif
				memcpy(addr,
					(struct sockaddr_in *)ifc->ifa_addr,
						    sizeof(struct sockaddr_in));
			break;
#ifdef LWS_WITH_IPV6
		case AF_INET6:
			memcpy(&addr6->sin6_addr,
			  &((struct sockaddr_in6 *)ifc->ifa_addr)->sin6_addr,
						       sizeof(struct in6_addr));
			break;
#endif
		default:
			continue;
		}
		rc = LWS_ITOSA_USABLE;
	}

	freeifaddrs(ifr);

	if (rc) {
		/* check if bind to IP address */
#ifdef LWS_WITH_IPV6
		if (inet_pton(AF_INET6, ifname, &addr6->sin6_addr) == 1)
			rc = LWS_ITOSA_USABLE;
		else
#endif
		if (inet_pton(AF_INET, ifname, &addr->sin_addr) == 1)
			rc = LWS_ITOSA_USABLE;
	}

	return rc;
}